

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

OptimizerResult
TasGrid::Optimizer::computeLocalMaximum<(TasGrid::TypeOneDRule)20>
          (CurrentNodes<(TasGrid::TypeOneDRule)20> *current,double left_node,double right_node)

{
  double dVar1;
  CurrentNodes<(TasGrid::TypeOneDRule)20> *pCVar2;
  double dVar3;
  double *pdVar4;
  OptimizerResult OVar5;
  double tolerance;
  OptimizerResult right;
  OptimizerResult left;
  double pattern;
  anon_class_8_1_c685f059 func;
  double right_node_local;
  double left_node_local;
  CurrentNodes<(TasGrid::TypeOneDRule)20> *current_local;
  OptimizerResult middle;
  
  left.value = (right_node - left_node) * 0.5;
  pattern = (double)current;
  func.current = (CurrentNodes<(TasGrid::TypeOneDRule)20> *)right_node;
  OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                    ((anon_class_8_1_c685f059 *)&pattern,left_node);
  left.node = OVar5.value;
  right.value = OVar5.node;
  OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                    ((anon_class_8_1_c685f059 *)&pattern,left_node + left.value);
  middle.node = OVar5.value;
  current_local = (CurrentNodes<(TasGrid::TypeOneDRule)20> *)OVar5.node;
  OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                    ((anon_class_8_1_c685f059 *)&pattern,(double)func.current);
  right.node = OVar5.value;
  tolerance = OVar5.node;
  while (dVar3 = middle.node, pCVar2 = current_local, 1e-15 < left.value) {
    pdVar4 = ::std::max<double>(&left.node,&right.node);
    dVar1 = left.node;
    if (dVar3 < *pdVar4) {
      pdVar4 = ::std::max<double>(&middle.node,&right.node);
      if (dVar1 < *pdVar4) {
        if (tolerance + left.value <= (double)func.current) {
          right.value = (double)current_local;
          left.node = middle.node;
          current_local = (CurrentNodes<(TasGrid::TypeOneDRule)20> *)tolerance;
          middle.node = right.node;
          OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::
                  operator()((anon_class_8_1_c685f059 *)&pattern,tolerance + left.value);
          right.node = OVar5.value;
          tolerance = OVar5.node;
        }
        else {
          left.value = left.value / 2.0;
          right.value = (double)current_local;
          left.node = middle.node;
          OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::
                  operator()((anon_class_8_1_c685f059 *)&pattern,tolerance - left.value);
          middle.node = OVar5.value;
          current_local = (CurrentNodes<(TasGrid::TypeOneDRule)20> *)OVar5.node;
        }
      }
      else {
        if (left_node <= right.value - left.value) {
          right.node = middle.node;
          current_local = (CurrentNodes<(TasGrid::TypeOneDRule)20> *)right.value;
          middle.node = left.node;
          OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::
                  operator()((anon_class_8_1_c685f059 *)&pattern,right.value - left.value);
          left.node = OVar5.value;
          right.value = OVar5.node;
        }
        else {
          left.value = left.value / 2.0;
          right.node = middle.node;
          OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::
                  operator()((anon_class_8_1_c685f059 *)&pattern,right.value + left.value);
          middle.node = OVar5.value;
          current_local = (CurrentNodes<(TasGrid::TypeOneDRule)20> *)OVar5.node;
        }
        tolerance = (double)pCVar2;
      }
    }
    else {
      left.value = left.value / 2.0;
      OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                        ((anon_class_8_1_c685f059 *)&pattern,(double)current_local - left.value);
      left.node = OVar5.value;
      right.value = OVar5.node;
      OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                        ((anon_class_8_1_c685f059 *)&pattern,(double)current_local + left.value);
      right.node = OVar5.value;
      tolerance = OVar5.node;
    }
  }
  OVar5 = performSecantSearch<(TasGrid::TypeOneDRule)20>(current,right.value,tolerance);
  middle.node = OVar5.value;
  OVar5 = computeLocalMaximum<(TasGrid::TypeOneDRule)20>::anon_class_8_1_c685f059::operator()
                    ((anon_class_8_1_c685f059 *)&pattern,OVar5.node);
  return OVar5;
}

Assistant:

OptimizerResult computeLocalMaximum(CurrentNodes<rule> const& current, double left_node, double right_node){
    auto func = [&](double x)->OptimizerResult{ return {x, getValue<rule>(current, x)}; };

    double pattern = 0.5 * (right_node - left_node); // pattern width
    OptimizerResult left   = func(left_node);
    OptimizerResult middle = func(left_node + pattern);
    OptimizerResult right  = func(right_node);

    // if differentiable, use coarse tolerance since we will post-process.
    double tolerance = (HasDerivative<rule>::value) ? Maths::num_tol * 1.E-3 : Maths::num_tol;

    while(pattern > tolerance){
        if (middle.value >= std::max(left.value, right.value)){ // middle is largest, shrink
            pattern /= 2.0;
            left  = func(middle.node - pattern);
            right = func(middle.node + pattern);
        }else if (left.value >= std::max(middle.value, right.value)){ // left is the largest
            if (left.node - pattern < left_node){ // if going out of bounds
                pattern /= 2.0;
                right  = middle;
                middle = func(left.node + pattern);
            }else{ // shift left
                right  = middle;
                middle = left;
                left  = func(middle.node - pattern);
            }
        }else{ // right must be the largest
            if (right.node + pattern > right_node){ // if going out of bounds
                pattern /= 2.0;
                left   = middle;
                middle = func(right.node - pattern);
            }else{ // shift right
                left   = middle;
                middle = right;
                right  = func(middle.node + pattern);
            }
        }
    }

    if (HasDerivative<rule>::value){
        middle = performSecantSearch(current, left.node, right.node); // this returns the derivative
        middle = func(middle.node);
    }

    return middle;
}